

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O2

void __thiscall CHuffman::Init(CHuffman *this,uint *pFrequencies)

{
  unsigned_short *puVar1;
  int i;
  ulong uVar2;
  CNode *pCVar3;
  int iVar4;
  uint *pFrequencies_00;
  ulong uVar5;
  bool bVar6;
  
  mem_zero(this,0x4020);
  pFrequencies_00 = gs_aFreqTable;
  if (pFrequencies != (uint *)0x0) {
    pFrequencies_00 = pFrequencies;
  }
  ConstructTree(this,pFrequencies_00);
  for (uVar2 = 0; uVar2 != 0x400; uVar2 = uVar2 + 1) {
    pCVar3 = this->m_pStartNode;
    iVar4 = 10;
    uVar5 = uVar2 & 0xffffffff;
    while ((bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6 &&
           (puVar1 = pCVar3->m_aLeafs, pCVar3 = this->m_aNodes + puVar1[(uint)uVar5 & 1],
           this->m_aNodes[puVar1[(uint)uVar5 & 1]].m_NumBits == 0))) {
      uVar5 = uVar5 >> 1;
    }
    this->m_apDecodeLut[uVar2] = pCVar3;
  }
  return;
}

Assistant:

void CHuffman::Init(const unsigned *pFrequencies)
{
	// make sure to cleanout every thing
	mem_zero(this, sizeof(*this));

	// construct the tree
	if(!pFrequencies)
		pFrequencies = gs_aFreqTable;
	ConstructTree(pFrequencies);

	// build decode LUT
	for(int i = 0; i < HUFFMAN_LUTSIZE; i++)
	{
		unsigned Bits = i;
		int k;
		CNode *pNode = m_pStartNode;
		for(k = 0; k < HUFFMAN_LUTBITS; k++)
		{
			pNode = &m_aNodes[pNode->m_aLeafs[Bits&1]];
			Bits >>= 1;

			if(!pNode)
				break;

			if(pNode->m_NumBits)
			{
				m_apDecodeLut[i] = pNode;
				break;
			}
		}

		if(k == HUFFMAN_LUTBITS)
			m_apDecodeLut[i] = pNode;
	}

}